

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char_type_conflict *
fmt::v5::internal::
parse_format_specs<int,fmt::v5::basic_parse_context<wchar_t,fmt::v5::internal::error_handler>>
          (basic_parse_context<wchar_t,_fmt::v5::internal::error_handler> *ctx)

{
  wchar_t *pwVar1;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>_>
  handler;
  error_handler local_79;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>_>
  local_78;
  dynamic_format_specs<wchar_t> local_58;
  
  local_78.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
  .super_specs_setter<wchar_t>.specs_ = &local_58.super_basic_format_specs<wchar_t>;
  local_58.width_ref.kind = NONE;
  local_58.width_ref._4_4_ = 0;
  local_58.width_ref.field_1.name.size = 0;
  local_58.precision_ref.kind = NONE;
  local_58.precision_ref._4_4_ = 0;
  local_58.precision_ref.field_1.name.size = 0;
  local_58.super_basic_format_specs<wchar_t>.super_align_spec.width_ = 0;
  local_58.super_basic_format_specs<wchar_t>.super_align_spec.fill_ = L' ';
  local_58.super_basic_format_specs<wchar_t>.super_align_spec.align_ = ALIGN_DEFAULT;
  local_58.super_basic_format_specs<wchar_t>.super_core_format_specs.precision = -1;
  local_58.super_basic_format_specs<wchar_t>.super_core_format_specs.flags = '\0';
  local_58.super_basic_format_specs<wchar_t>.super_core_format_specs.type = '\0';
  local_58.super_basic_format_specs<wchar_t>.super_core_format_specs._6_2_ = 0;
  local_58._20_4_ = 0;
  local_58.width_ref.field_1.name.value = (wchar_t *)0x0;
  local_58.precision_ref.field_1.name.value = (wchar_t *)0x0;
  local_78.arg_type_ = int_type;
  pwVar1 = (ctx->format_str_).data_;
  local_78.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
  .specs_ = (dynamic_format_specs<wchar_t> *)
            local_78.
            super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
            .super_specs_setter<wchar_t>.specs_;
  local_78.
  super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
  .context_ = ctx;
  pwVar1 = parse_format_specs<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,fmt::v5::internal::error_handler>>>&>
                     (pwVar1,pwVar1 + (ctx->format_str_).size_,&local_78);
  if (((0x36 < (byte)local_58.super_basic_format_specs<wchar_t>.super_core_format_specs.type - 0x42)
      || ((0x40300500400001U >>
           ((ulong)((byte)local_58.super_basic_format_specs<wchar_t>.super_core_format_specs.type -
                   0x42) & 0x3f) & 1) == 0)) &&
     (local_58.super_basic_format_specs<wchar_t>.super_core_format_specs.type != 0)) {
    error_handler::on_error(&local_79,"invalid type specifier");
  }
  return pwVar1;
}

Assistant:

FMT_CONSTEXPR wchar_t fill() const { return fill_; }